

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ImageFeatureType::ImageFeatureType
          (ImageFeatureType *this,ImageFeatureType *from)

{
  void *pvVar1;
  int64 iVar2;
  ImageFeatureType_ImageSizeRange *this_00;
  ImageFeatureType_EnumeratedImageSizes *this_01;
  ImageFeatureType_ImageSizeRange *from_00;
  ImageFeatureType_EnumeratedImageSizes *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImageFeatureType_004266d8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->colorspace_ = from->colorspace_;
  iVar2 = from->height_;
  this->width_ = from->width_;
  this->height_ = iVar2;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x15) {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x15;
    this_01 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
    ImageFeatureType_EnumeratedImageSizes::ImageFeatureType_EnumeratedImageSizes(this_01);
    (this->SizeFlexibility_).enumeratedsizes_ = this_01;
    if (from->_oneof_case_[0] == 0x15) {
      from_01 = (from->SizeFlexibility_).enumeratedsizes_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_01 = (ImageFeatureType_EnumeratedImageSizes *)
                &_ImageFeatureType_EnumeratedImageSizes_default_instance_;
    }
    ImageFeatureType_EnumeratedImageSizes::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x1f) {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    this_00 = (ImageFeatureType_ImageSizeRange *)operator_new(0x28);
    ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange(this_00);
    (this->SizeFlexibility_).imagesizerange_ = this_00;
    if (from->_oneof_case_[0] == 0x1f) {
      from_00 = (from->SizeFlexibility_).imagesizerange_;
    }
    else {
      protobuf_FeatureTypes_2eproto::InitDefaults();
      from_00 = (ImageFeatureType_ImageSizeRange *)
                &_ImageFeatureType_ImageSizeRange_default_instance_;
    }
    ImageFeatureType_ImageSizeRange::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

ImageFeatureType::ImageFeatureType(const ImageFeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&width_, &from.width_,
    reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_has_SizeFlexibility();
  switch (from.SizeFlexibility_case()) {
    case kEnumeratedSizes: {
      mutable_enumeratedsizes()->::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::MergeFrom(from.enumeratedsizes());
      break;
    }
    case kImageSizeRange: {
      mutable_imagesizerange()->::CoreML::Specification::ImageFeatureType_ImageSizeRange::MergeFrom(from.imagesizerange());
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ImageFeatureType)
}